

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

int __thiscall glu::Program::link(Program *this,char *__from,char *__to)

{
  bool bVar1;
  GLenum err;
  int iVar2;
  deUint64 dVar3;
  undefined8 uVar4;
  string local_38;
  deUint64 local_18;
  deUint64 linkStart;
  Program *this_local;
  
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  linkStart = (deUint64)this;
  std::__cxx11::string::clear();
  local_18 = deGetMicroseconds();
  (*this->m_gl->linkProgram)(this->m_program);
  dVar3 = deGetMicroseconds();
  (this->m_info).linkTimeUs = dVar3 - local_18;
  err = (*this->m_gl->getError)();
  uVar4 = 0;
  checkError(err,"glLinkProgram()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0xef);
  bVar1 = getProgramLinkStatus(this->m_gl,this->m_program);
  (this->m_info).linkOk = bVar1;
  getProgramInfoLog_abi_cxx11_
            (&local_38,(glu *)this->m_gl,(Functions *)(ulong)this->m_program,
             (deUint32)CONCAT71((int7)((ulong)uVar4 >> 8),bVar1));
  std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_38);
  iVar2 = std::__cxx11::string::~string((string *)&local_38);
  return iVar2;
}

Assistant:

void Program::link (void)
{
	m_info.linkOk		= false;
	m_info.linkTimeUs	= 0;
	m_info.infoLog.clear();

	{
		deUint64 linkStart = deGetMicroseconds();
		m_gl.linkProgram(m_program);
		m_info.linkTimeUs = deGetMicroseconds() - linkStart;
	}
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glLinkProgram()");

	m_info.linkOk	= getProgramLinkStatus(m_gl, m_program);
	m_info.infoLog	= getProgramInfoLog(m_gl, m_program);
}